

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_small_vector.cpp
# Opt level: O1

void __thiscall
SmallVector_EmplaceBack_Test::~SmallVector_EmplaceBack_Test(SmallVector_EmplaceBack_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST (SmallVector, EmplaceBack) {
    using ::testing::ElementsAre;
    pstore::small_vector<int, 2> a;
    a.emplace_back (1);
    EXPECT_THAT (a, ElementsAre (1));
    a.emplace_back (2);
    EXPECT_THAT (a, ElementsAre (1, 2));
    a.emplace_back (3);
    EXPECT_THAT (a, ElementsAre (1, 2, 3));
    a.emplace_back (4);
    EXPECT_THAT (a, ElementsAre (1, 2, 3, 4));
}